

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BpTree2.h
# Opt level: O1

void __thiscall BpTree<float>::UpdateTree(BpTree<float> *this)

{
  pointer *ppiVar1;
  pointer piVar2;
  pointer piVar3;
  pointer pcVar4;
  int BlockNum;
  long lVar5;
  uint uVar6;
  long lVar7;
  int iVar8;
  string local_70;
  string local_50;
  
  piVar2 = (this->FileOff_bin).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  piVar3 = (this->FileOff_bin).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  pcVar4 = (this->Index_FileName)._M_dataplus._M_p;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,pcVar4,pcVar4 + (this->Index_FileName)._M_string_length);
  BlockNum = Buffer::Find(&blocks,&local_50,0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if (BlockNum == -1) {
    pcVar4 = (this->Index_FileName)._M_dataplus._M_p;
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_70,pcVar4,pcVar4 + (this->Index_FileName)._M_string_length);
    BlockNum = Buffer::Allocate(&blocks,&local_70,0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
  }
  lVar5 = (long)BlockNum;
  blocks.buffer[lVar5].data[0] = this->Data_Type;
  *(int *)(blocks.buffer[lVar5].data + 1) = this->N;
  *(int *)(blocks.buffer[lVar5].data + 5) = (this->RootAddr).FileOff;
  *(int *)(blocks.buffer[lVar5].data + 9) = this->Current_Off;
  iVar8 = (int)((ulong)((long)piVar2 - (long)piVar3) >> 2);
  *(int *)(blocks.buffer[lVar5].data + 0xd) = iVar8;
  if (0 < iVar8) {
    uVar6 = 999;
    if (iVar8 - 1U < 999) {
      uVar6 = iVar8 - 1U;
    }
    lVar7 = 0;
    do {
      *(int *)(lVar5 * 0x2028 + 0x15e3dd + lVar7 * 4) =
           (this->FileOff_bin).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish[-1];
      ppiVar1 = &(this->FileOff_bin).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish;
      *ppiVar1 = *ppiVar1 + -1;
      lVar7 = lVar7 + 1;
    } while (uVar6 + 1 != (int)lVar7);
  }
  Buffer::Lock(&blocks,BlockNum);
  return;
}

Assistant:

void BpTree<K>::UpdateTree(void) {
	int i, s = this->FileOff_bin.size();
	int BlockNum = blocks.Find(this->Index_FileName, 0);
	if (BlockNum == -1) {
		BlockNum = blocks.Allocate(this->Index_FileName, 0);
	}
	char* p = blocks.buffer[BlockNum].data;
	memcpy(p, &this->Data_Type, sizeof(char));
	p += sizeof(char);
	memcpy(p, reinterpret_cast<char*>(&this->N), sizeof(int));
	p += sizeof(int);
	memcpy(p, reinterpret_cast<char*>(&this->RootAddr.FileOff), sizeof(int));
	p += sizeof(int);
	memcpy(p, reinterpret_cast<char*>(&this->Current_Off), sizeof(int));
	p += sizeof(int);
	memcpy(p, reinterpret_cast<char*>(&s), sizeof(int));
	p += sizeof(int);
	for (i = 0; i < s && i < 1000; i++) {
		memcpy(p, reinterpret_cast<char*>(&this->FileOff_bin.back()), sizeof(int));
		p += sizeof(int);
		this->FileOff_bin.pop_back();
	}
	blocks.Lock(BlockNum);
}